

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

bool duckdb_yyjson::unsafe_yyjson_mut_ptr_putx
               (yyjson_mut_val *val,char *ptr,size_t ptr_len,yyjson_mut_val *new_val,
               yyjson_mut_doc *doc,bool create_parent,bool insert_new,yyjson_ptr_ctx *ctx,
               yyjson_ptr_err *err)

{
  yyjson_val_pool *pyVar1;
  yyjson_str_pool *pyVar2;
  yyjson_alc *alc;
  byte *pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  yyjson_val_uni yVar8;
  yyjson_mut_val *pyVar9;
  yyjson_val_uni yVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong __n;
  byte *pbVar13;
  size_t sVar14;
  byte bVar15;
  byte *pbVar16;
  yyjson_mut_val *key;
  ulong *puVar17;
  ulong *puVar18;
  long lVar19;
  ulong uVar20;
  yyjson_mut_val *pyVar21;
  yyjson_mut_val *pyVar22;
  yyjson_mut_val *pyVar23;
  byte *__s2;
  byte *pbVar24;
  ulong uVar25;
  yyjson_mut_val *pyVar26;
  ulong uVar27;
  ulong uVar28;
  yyjson_mut_val *pyVar29;
  byte local_a9;
  ulong local_a0;
  byte *local_98;
  byte local_78;
  byte local_49;
  
  pbVar16 = (byte *)(ptr + ptr_len);
  sVar7 = -(long)ptr;
  bVar4 = false;
  pbVar11 = (byte *)ptr;
  do {
    pyVar22 = val;
    __s2 = pbVar11 + 1;
    for (pbVar24 = __s2; ((pbVar24 < pbVar16 && (*pbVar24 != 0x2f)) && (*pbVar24 != 0x7e));
        pbVar24 = pbVar24 + 1) {
    }
    if ((pbVar24 == pbVar16) || (*pbVar24 != 0x7e)) {
      local_98 = pbVar24 + -(long)__s2;
      lVar19 = 0;
    }
    else {
      if (pbVar24 < pbVar16) {
        sVar14 = sVar7 + (long)pbVar24;
        bVar15 = 0x7e;
        lVar19 = 0;
        do {
          pbVar24 = pbVar24 + 1;
          if (bVar15 == 0x7e) {
            if ((pbVar24 == pbVar16) || ((*pbVar24 & 0xfe) != 0x30)) goto joined_r0x018859a6;
            lVar19 = lVar19 + 1;
          }
          if (pbVar16 <= pbVar24) break;
          bVar15 = *pbVar24;
          sVar14 = sVar14 + 1;
        } while (bVar15 != 0x2f);
      }
      else {
        lVar19 = 0;
      }
      local_98 = pbVar24 + (-(long)__s2 - lVar19);
    }
    local_a0 = pyVar22->tag;
    local_78 = (byte)local_a0 & 7;
    if (((byte)local_a0 & 7) != 6) {
      if (((uint)local_a0 & 7) != 7) goto LAB_01885ae2;
      bVar15 = 7;
      if (0xff < local_a0) {
        uVar20 = local_a0 >> 8;
        pyVar9 = (yyjson_mut_val *)(pyVar22->uni).u64;
        do {
          pyVar21 = pyVar9->next->next;
          if ((byte *)(pyVar21->tag >> 8) == local_98) {
            if (lVar19 != 0) {
              if (local_98 != (byte *)0x0) {
                pbVar12 = (byte *)0x0;
                pbVar11 = __s2;
                do {
                  if (*pbVar11 == 0x7e) {
                    bVar15 = 0x2f;
                    if (pbVar11[1] == 0x30) {
                      bVar15 = 0x7e;
                    }
                    if (bVar15 != (pyVar21->uni).str[(long)pbVar12]) goto LAB_0188519a;
                    pbVar11 = pbVar11 + 1;
                  }
                  else if ((pyVar21->uni).str[(long)pbVar12] != *pbVar11) goto LAB_0188519a;
                  pbVar11 = pbVar11 + 1;
                  pbVar12 = pbVar12 + 1;
                  if (local_98 == pbVar12) break;
                } while( true );
              }
              goto LAB_018852ac;
            }
            iVar6 = bcmp((pyVar21->uni).ptr,__s2,(size_t)local_98);
            if (iVar6 == 0) goto LAB_018852ac;
          }
LAB_0188519a:
          uVar20 = uVar20 - 1;
          pyVar9 = pyVar21;
          if (uVar20 == 0) {
            bVar15 = 7;
            break;
          }
        } while( true );
      }
LAB_0188538e:
      local_78 = bVar15;
      pyVar9 = (yyjson_mut_val *)0x0;
      val = (yyjson_mut_val *)0x0;
      if (pbVar24 != pbVar16) goto LAB_018859f8;
      val = (yyjson_mut_val *)0x0;
      goto LAB_018853b1;
    }
    if (local_a0 < 0x100) {
      if (local_98 == (byte *)0x1) {
        bVar4 = *__s2 == 0x2d || *__s2 == 0x30;
        local_98 = (byte *)0x1;
        bVar15 = 6;
      }
      else {
        bVar4 = false;
        bVar15 = 6;
      }
      goto LAB_0188538e;
    }
    if (local_98 + -0x14 < (byte *)0xffffffffffffffed) {
LAB_0188586e:
      bVar4 = false;
LAB_018856e1:
      bVar15 = 6;
      goto LAB_0188538e;
    }
    pyVar21 = (yyjson_mut_val *)(pyVar22->uni).u64;
    if (*__s2 != 0x30) {
      if (*__s2 != 0x2d) {
        uVar20 = 0;
        pbVar12 = __s2;
        do {
          if (9 < (ulong)*pbVar12 - 0x30) {
            bVar4 = false;
            goto LAB_018856e1;
          }
          uVar20 = ((ulong)*pbVar12 - 0x30) + uVar20 * 10;
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 < pbVar11 + (long)(local_98 + 1));
        bVar15 = local_78;
        if (uVar20 == 0) {
          bVar4 = false;
        }
        else {
          bVar4 = uVar20 == 0xffffffffffffffff || uVar20 == local_a0 >> 8;
          if (uVar20 < local_a0 >> 8) {
            do {
              pyVar21 = pyVar21->next;
              uVar20 = uVar20 - 1;
              pyVar9 = pyVar21;
            } while (uVar20 != 0);
            goto LAB_018852ac;
          }
        }
        goto LAB_0188538e;
      }
      if ((byte *)0x1 < local_98) goto LAB_0188586e;
      bVar4 = true;
      local_98 = (byte *)0x1;
      goto LAB_018856e1;
    }
    bVar4 = false;
    pyVar9 = pyVar21;
    if ((byte *)0x1 < local_98) goto LAB_018856e1;
LAB_018852ac:
    val = pyVar21->next;
  } while ((pbVar24 != pbVar16) && (pbVar11 = pbVar24, val != (yyjson_mut_val *)0x0));
  if (pbVar24 != pbVar16) {
LAB_018859f8:
    if (!create_parent) goto LAB_01885ae2;
    if (local_78 != 6) {
      pyVar21 = (yyjson_mut_val *)0x0;
      local_a9 = local_78;
LAB_01885b2a:
      local_78 = local_a9;
      if (pbVar24 != pbVar16) {
        pyVar2 = &doc->str_pool;
        alc = &doc->alc;
        pyVar1 = &doc->val_pool;
        pyVar29 = pyVar22;
        do {
          if (lVar19 == 0) {
            if (doc == (yyjson_mut_doc *)0x0) goto joined_r0x01886090;
            pyVar23 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar23) {
              bVar5 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (bVar5) {
                pyVar23 = pyVar1->cur;
                goto LAB_01885b7f;
              }
              pyVar23 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_01885b7f:
              pyVar1->cur = pyVar23 + 1;
            }
            pbVar12 = (byte *)(doc->str_pool).cur;
            if ((doc->str_pool).end + -(long)pbVar12 <= local_98) {
              bVar5 = unsafe_yyjson_str_pool_grow(pyVar2,alc,(usize)(local_98 + 1));
              if (!bVar5) goto joined_r0x01886090;
              pbVar12 = (byte *)pyVar2->cur;
            }
            pyVar2->cur = (char *)(pbVar12 + (long)(local_98 + 1));
            if (pbVar12 == (byte *)0x0) goto joined_r0x01886090;
            switchD_012b9b0d::default(pbVar12,__s2,(size_t)local_98);
            pbVar12[(long)local_98] = 0;
          }
          else {
            pbVar11 = local_98 + lVar19;
            pbVar12 = (byte *)(doc->str_pool).cur;
            if ((doc->str_pool).end + -(long)pbVar12 <= pbVar11) {
              bVar5 = unsafe_yyjson_str_pool_grow(pyVar2,alc,(usize)(pbVar11 + 1));
              if (!bVar5) goto joined_r0x01886090;
              pbVar12 = (byte *)pyVar2->cur;
            }
            pyVar2->cur = (char *)(pbVar12 + (long)(pbVar11 + 1));
            if (pbVar12 == (byte *)0x0) goto joined_r0x01886090;
            pbVar13 = __s2 + (long)(local_98 + lVar19);
            pbVar11 = pbVar12;
            if (__s2 < pbVar13) {
              do {
                bVar15 = *__s2;
                if (*__s2 == 0x7e) {
                  pbVar3 = __s2 + 1;
                  __s2 = __s2 + 1;
                  bVar15 = 0x2f;
                  if (*pbVar3 == 0x30) {
                    bVar15 = 0x7e;
                  }
                }
                *pbVar11 = bVar15;
                __s2 = __s2 + 1;
                pbVar11 = pbVar11 + 1;
              } while (__s2 < pbVar13);
              *pbVar11 = 0;
              if (doc == (yyjson_mut_doc *)0x0) goto joined_r0x01886090;
            }
            else {
              *pbVar12 = 0;
            }
            pyVar23 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar23) {
              bVar5 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (!bVar5) goto joined_r0x01886090;
              pyVar23 = pyVar1->cur;
            }
            pyVar1->cur = pyVar23 + 1;
          }
          if (pyVar23 == (yyjson_mut_val *)0x0) goto joined_r0x01886090;
          pyVar23->tag = (long)local_98 << 8 | 5;
          (pyVar23->uni).ptr = pbVar12;
          pyVar22 = (doc->val_pool).cur;
          if ((doc->val_pool).end == pyVar22) {
            bVar5 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
            if (!bVar5) goto joined_r0x01886090;
            pyVar22 = pyVar1->cur;
          }
          pyVar1->cur = pyVar22 + 1;
          if (pyVar22 == (yyjson_mut_val *)0x0) goto joined_r0x01886090;
          pyVar22->tag = 7;
          pyVar26 = pyVar29;
          if (((pyVar21 != (yyjson_mut_val *)0x0) &&
              (pyVar26 = pyVar21, (~(uint)pyVar29->tag & 7) == 0)) && ((pyVar23->tag & 7) == 5)) {
            unsafe_yyjson_mut_ptr_putx();
          }
          __s2 = pbVar24 + 1;
          for (pbVar24 = __s2; ((pbVar24 < pbVar16 && (*pbVar24 != 0x2f)) && (*pbVar24 != 0x7e));
              pbVar24 = pbVar24 + 1) {
          }
          if ((pbVar24 == pbVar16) || (*pbVar24 != 0x7e)) {
            local_98 = pbVar24 + -(long)__s2;
            lVar19 = 0;
          }
          else {
            if (pbVar24 < pbVar16) {
              sVar14 = sVar7 + (long)pbVar24;
              bVar15 = 0x7e;
              lVar19 = 0;
              do {
                pbVar24 = pbVar24 + 1;
                if (bVar15 == 0x7e) {
                  if ((pbVar24 == pbVar16) || ((*pbVar24 & 0xfe) != 0x30)) goto joined_r0x018859a6;
                  lVar19 = lVar19 + 1;
                }
                if (pbVar16 <= pbVar24) break;
                bVar15 = *pbVar24;
                sVar14 = sVar14 + 1;
              } while (bVar15 != 0x2f);
            }
            else {
              lVar19 = 0;
            }
            local_98 = pbVar24 + (-(long)__s2 - lVar19);
          }
          pyVar21 = pyVar26;
          pyVar29 = pyVar22;
        } while (pbVar24 != pbVar16);
        local_a0 = pyVar22->tag;
        val = (yyjson_mut_val *)0x0;
      }
      goto LAB_018853b1;
    }
    if ((bVar4 & insert_new) == 0) {
      if (err == (yyjson_ptr_err *)0x0) goto LAB_01885aff;
      err->code = 3;
      err->msg = "JSON pointer cannot be resolved";
      sVar7 = (long)__s2 - (long)ptr;
LAB_01885afb:
      err->pos = sVar7;
      goto LAB_01885aff;
    }
    if (doc != (yyjson_mut_doc *)0x0) {
      pyVar1 = &doc->val_pool;
      pyVar29 = (doc->val_pool).cur;
      if ((doc->val_pool).end == pyVar29) {
        bVar5 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
        if (!bVar5) goto joined_r0x01886090;
        pyVar29 = pyVar1->cur;
      }
      pyVar1->cur = pyVar29 + 1;
      if (pyVar29 != (yyjson_mut_val *)0x0) {
        pyVar29->tag = 7;
        __s2 = pbVar24 + 1;
        for (pbVar24 = __s2; ((pbVar24 < pbVar16 && (*pbVar24 != 0x2f)) && (*pbVar24 != 0x7e));
            pbVar24 = pbVar24 + 1) {
        }
        if ((pbVar24 == pbVar16) || (*pbVar24 != 0x7e)) {
          local_98 = pbVar24 + -(long)__s2;
          lVar19 = 0;
        }
        else {
          if (pbVar24 < pbVar16) {
            bVar15 = 0x7e;
            lVar19 = 0;
            do {
              pbVar24 = pbVar24 + 1;
              if (bVar15 == 0x7e) {
                if ((pbVar24 == pbVar16) || ((*pbVar24 & 0xfe) != 0x30)) {
                  if (err != (yyjson_ptr_err *)0x0) {
                    err->code = 3;
                    err->msg = "JSON pointer cannot be resolved";
                    err->pos = sVar7;
                  }
                  goto LAB_01885aff;
                }
                lVar19 = lVar19 + 1;
              }
            } while ((pbVar24 < pbVar16) && (bVar15 = *pbVar24, bVar15 != 0x2f));
          }
          else {
            lVar19 = 0;
          }
          local_98 = pbVar24 + (-(long)__s2 - lVar19);
        }
        local_a0 = 7;
        local_a9 = 7;
        val = (yyjson_mut_val *)0x0;
        pyVar21 = pyVar22;
        pyVar22 = pyVar29;
        goto LAB_01885b2a;
      }
    }
    goto joined_r0x01886090;
  }
LAB_018853b1:
  if (local_78 == 7) {
    if (ctx == (yyjson_ptr_ctx *)0x0) {
      if (val == (yyjson_mut_val *)0x0 || insert_new) goto LAB_018854f5;
      pyVar21 = pyVar9->next->next;
    }
    else {
      ctx->ctn = pyVar22;
      if (val == (yyjson_mut_val *)0x0 || insert_new) {
LAB_018854f5:
        if (lVar19 == 0) {
          if (doc != (yyjson_mut_doc *)0x0) {
            pyVar1 = &doc->val_pool;
            yVar8 = (yyjson_val_uni)(doc->val_pool).cur;
            if ((doc->val_pool).end == (yyjson_mut_val *)yVar8.u64) {
              bVar4 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
              if (bVar4) {
                yVar8.str = (char *)pyVar1->cur;
                goto LAB_01885527;
              }
              yVar8.u64 = 0;
            }
            else {
LAB_01885527:
              pyVar1->cur = (yyjson_mut_val *)(yVar8.u64 + 0x18);
            }
            pyVar2 = &doc->str_pool;
            pbVar11 = (byte *)(doc->str_pool).cur;
            if ((doc->str_pool).end + -(long)pbVar11 <= local_98) {
              bVar4 = unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,(usize)(local_98 + 1));
              if (!bVar4) goto joined_r0x01886090;
              pbVar11 = (byte *)pyVar2->cur;
            }
            pyVar2->cur = (char *)(pbVar11 + (long)(local_98 + 1));
            if (pbVar11 != (byte *)0x0) {
              switchD_012b9b0d::default(pbVar11,__s2,(size_t)local_98);
              pbVar11[(long)local_98] = 0;
              goto LAB_01885578;
            }
          }
        }
        else {
          pbVar16 = local_98 + lVar19;
          pyVar2 = &doc->str_pool;
          pbVar11 = (byte *)(doc->str_pool).cur;
          if ((doc->str_pool).end + -(long)pbVar11 <= pbVar16) {
            bVar4 = unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,(usize)(pbVar16 + 1));
            if (!bVar4) goto joined_r0x01886090;
            pbVar11 = (byte *)pyVar2->cur;
          }
          pyVar2->cur = (char *)(pbVar11 + (long)(pbVar16 + 1));
          if (pbVar11 == (byte *)0x0) goto joined_r0x01886090;
          pbVar24 = __s2 + (long)(local_98 + lVar19);
          pbVar16 = pbVar11;
          if (__s2 < pbVar24) {
            do {
              bVar15 = *__s2;
              if (*__s2 == 0x7e) {
                pbVar12 = __s2 + 1;
                __s2 = __s2 + 1;
                bVar15 = 0x2f;
                if (*pbVar12 == 0x30) {
                  bVar15 = 0x7e;
                }
              }
              *pbVar16 = bVar15;
              __s2 = __s2 + 1;
              pbVar16 = pbVar16 + 1;
            } while (__s2 < pbVar24);
            *pbVar16 = 0;
            if (doc == (yyjson_mut_doc *)0x0) goto joined_r0x01886090;
          }
          else {
            *pbVar11 = 0;
          }
          pyVar1 = &doc->val_pool;
          yVar8 = (yyjson_val_uni)(doc->val_pool).cur;
          if ((doc->val_pool).end == (yyjson_mut_val *)yVar8.u64) {
            bVar4 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
            if (!bVar4) goto joined_r0x01886090;
            yVar8.str = (char *)pyVar1->cur;
          }
          pyVar1->cur = (yyjson_mut_val *)(yVar8.u64 + 0x18);
LAB_01885578:
          if ((ulong *)yVar8.u64 != (ulong *)0x0) {
            *(ulong *)yVar8.str = (long)local_98 << 8 | 5;
            *(byte **)(yVar8.u64 + 8) = pbVar11;
            if (ctx != (yyjson_ptr_ctx *)0x0) {
              yVar10 = yVar8;
              if (0xff < local_a0) {
                yVar10 = pyVar22->uni;
              }
              ctx->pre = (yyjson_mut_val *)yVar10;
            }
            yVar10 = yVar8;
            if (0xff < local_a0) {
              lVar19 = *(long *)((pyVar22->uni).u64 + 0x10);
              yVar10 = *(yyjson_val_uni *)(lVar19 + 0x10);
              ((yyjson_val_uni *)(lVar19 + 0x10))->str = (char *)yVar8;
            }
            new_val->next = (yyjson_mut_val *)yVar10;
            *(yyjson_mut_val **)(yVar8.u64 + 0x10) = new_val;
            (pyVar22->uni).str = (char *)yVar8;
            pyVar22->tag = (ulong)(byte)pyVar22->tag + (local_a0 & 0xffffffffffffff00) + 0x100;
            goto LAB_01885608;
          }
        }
joined_r0x01886090:
        if (err != (yyjson_ptr_err *)0x0) {
          err->code = 6;
          err->msg = "failed to create value";
          err->pos = 0;
        }
        goto LAB_01885aff;
      }
      pyVar21 = pyVar9->next->next;
      ctx->pre = pyVar9;
      ctx->old = val;
    }
    if ((((~(uint)local_a0 & 7) == 0) && (pyVar21 != (yyjson_mut_val *)0x0)) &&
       (((uint)pyVar21->tag & 7) == 5)) {
      if (local_a0 < 0x100) {
        uVar27 = 0;
        bVar4 = false;
      }
      else {
        uVar27 = local_a0 >> 8;
        __n = pyVar21->tag >> 8;
        bVar4 = false;
        puVar17 = (ulong *)(pyVar22->uni).u64;
        uVar20 = 0;
        do {
          uVar25 = puVar17[2];
          puVar18 = *(ulong **)(uVar25 + 0x10);
          if (puVar18 == (ulong *)0x0) break;
          uVar28 = uVar20 + 1;
          if ((*puVar18 >> 8 == __n) &&
             (iVar6 = bcmp((void *)puVar18[1],(pyVar21->uni).ptr,__n), iVar6 == 0)) {
            pyVar9 = *(yyjson_mut_val **)(puVar18[2] + 0x10);
            if (new_val == (yyjson_mut_val *)0x0 || bVar4) {
              if (uVar28 == uVar27) {
                (pyVar22->uni).u64 = (uint64_t)puVar17;
                uVar25 = puVar17[2];
              }
              uVar27 = uVar27 - 1;
              local_a0 = uVar27 * 0x100 | local_a0 & 0xff;
              pyVar22->tag = local_a0;
              *(yyjson_mut_val **)(uVar25 + 0x10) = pyVar9;
              puVar18 = puVar17;
              uVar28 = uVar20;
            }
            else {
              new_val->next = pyVar9;
              puVar18[2] = (ulong)new_val;
              bVar4 = true;
            }
          }
          puVar17 = puVar18;
          uVar20 = uVar28;
        } while (uVar28 < uVar27);
      }
      if (new_val != (yyjson_mut_val *)0x0 && !bVar4) {
        pyVar9 = pyVar21;
        if (uVar27 != 0) {
          lVar19 = *(long *)((pyVar22->uni).u64 + 0x10);
          pyVar9 = *(yyjson_mut_val **)(lVar19 + 0x10);
          *(yyjson_mut_val **)(lVar19 + 0x10) = pyVar21;
        }
        new_val->next = pyVar9;
        pyVar21->next = new_val;
        (pyVar22->uni).str = (char *)pyVar21;
        local_a0 = (local_a0 & 0xff) + uVar27 * 0x100;
LAB_0188583d:
        pyVar22->tag = local_a0 + 0x100;
      }
    }
  }
  else {
    if (ctx != (yyjson_ptr_ctx *)0x0) {
      if ((val == (yyjson_mut_val *)0x0) && (bVar4 == false)) goto LAB_01885ae2;
      ctx->ctn = pyVar22;
    }
    if (insert_new) {
      if (val != (yyjson_mut_val *)0x0) {
        pyVar9->next = new_val;
        new_val->next = val;
        if (ctx != (yyjson_ptr_ctx *)0x0) {
          ctx->pre = pyVar9;
        }
        goto LAB_0188583d;
      }
      if (bVar4 == false) goto LAB_01885ae2;
      if (ctx != (yyjson_ptr_ctx *)0x0) {
        yVar8 = (yyjson_val_uni)new_val;
        if (0xff < local_a0) {
          yVar8 = pyVar22->uni;
        }
        ctx->pre = (yyjson_mut_val *)yVar8;
      }
      if ((new_val != (yyjson_mut_val *)0x0) && (((uint)local_a0 & 7) == 6)) {
        pyVar22->tag = (local_a0 & 0xfffffffffffffffe) + 0x100;
        pyVar9 = new_val;
        if (0xff < local_a0) {
          pyVar9 = *(yyjson_mut_val **)((pyVar22->uni).u64 + 0x10);
          *(yyjson_mut_val **)((pyVar22->uni).u64 + 0x10) = new_val;
        }
        new_val->next = pyVar9;
        (pyVar22->uni).str = (char *)new_val;
      }
    }
    else {
      if (val == (yyjson_mut_val *)0x0) {
LAB_01885ae2:
        if (err != (yyjson_ptr_err *)0x0) {
          err->code = 3;
          err->msg = "JSON pointer cannot be resolved";
          sVar7 = (long)__s2 - (long)ptr;
          goto LAB_01885afb;
        }
        goto LAB_01885aff;
      }
      if (local_a0 < 0x200) {
        new_val->next = new_val;
        pyVar9 = new_val;
LAB_01885855:
        (pyVar22->uni).str = (char *)new_val;
      }
      else {
        new_val->next = val->next;
        pyVar9->next = new_val;
        if ((yyjson_mut_val *)(pyVar22->uni).u64 == val) goto LAB_01885855;
      }
      if (ctx != (yyjson_ptr_ctx *)0x0) {
        ctx->pre = pyVar9;
        ctx->old = val;
      }
    }
  }
LAB_01885608:
  unsafe_yyjson_mut_ptr_putx();
LAB_01885b01:
  return (bool)(local_49 & 1);
joined_r0x018859a6:
  if (err != (yyjson_ptr_err *)0x0) {
    err->code = 2;
    err->msg = "invalid escaped character";
    err->pos = sVar14;
  }
LAB_01885aff:
  local_49 = 0;
  goto LAB_01885b01;
}

Assistant:

bool unsafe_yyjson_mut_ptr_putx(yyjson_mut_val *val,
                                const char *ptr, size_t ptr_len,
                                yyjson_mut_val *new_val,
                                yyjson_mut_doc *doc,
                                bool create_parent, bool insert_new,
                                yyjson_ptr_ctx *ctx,
                                yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize token_len, esc, ctn_len;
    yyjson_mut_val *ctn, *key, *pre = NULL;
    yyjson_mut_val *sep_ctn = NULL, *sep_key = NULL, *sep_val = NULL;
    yyjson_type ctn_type;
    bool idx_is_last = false;

    /* skip exist parent nodes */
    while (true) {
        token = ptr_next_token(&ptr, end, &token_len, &esc);
        if (unlikely(!token)) return_err_syntax(false, ptr - hdr);
        ctn = val;
        ctn_type = unsafe_yyjson_get_type(ctn);
        if (ctn_type == YYJSON_TYPE_OBJ) {
            val = ptr_mut_obj_get(ctn, token, token_len, esc, &pre);
        } else if (ctn_type == YYJSON_TYPE_ARR) {
            val = ptr_mut_arr_get(ctn, token, token_len, esc, &pre,
                                  &idx_is_last);
        } else return_err_resolve(false, token - hdr);
        if (!val) break;
        if (ptr == end) break; /* is last token */
    }

    /* create parent nodes if not exist */
    if (unlikely(ptr != end)) { /* not last token */
        if (!create_parent) return_err_resolve(false, token - hdr);

        /* add value at last index if container is array */
        if (ctn_type == YYJSON_TYPE_ARR) {
            if (!idx_is_last || !insert_new) {
                return_err_resolve(false, token - hdr);
            }
            val = yyjson_mut_obj(doc);
            if (!val) return_err_alloc(false);

            /* delay attaching until all operations are completed */
            sep_ctn = ctn;
            sep_key = NULL;
            sep_val = val;

            /* move to next token */
            ctn = val;
            val = NULL;
            ctn_type = YYJSON_TYPE_OBJ;
            token = ptr_next_token(&ptr, end, &token_len, &esc);
            if (unlikely(!token)) return_err_resolve(false, token - hdr);
        }

        /* container is object, create parent nodes */
        while (ptr != end) { /* not last token */
            key = ptr_new_key(token, token_len, esc, doc);
            if (!key) return_err_alloc(false);
            val = yyjson_mut_obj(doc);
            if (!val) return_err_alloc(false);

            /* delay attaching until all operations are completed */
            if (!sep_ctn) {
                sep_ctn = ctn;
                sep_key = key;
                sep_val = val;
            } else {
                yyjson_mut_obj_add(ctn, key, val);
            }

            /* move to next token */
            ctn = val;
            val = NULL;
            token = ptr_next_token(&ptr, end, &token_len, &esc);
            if (unlikely(!token)) return_err_syntax(false, ptr - hdr);
        }
    }

    /* JSON pointer is resolved, insert or replace target value */
    ctn_len = unsafe_yyjson_get_len(ctn);
    if (ctn_type == YYJSON_TYPE_OBJ) {
        if (ctx) ctx->ctn = ctn;
        if (!val || insert_new) {
            /* insert new key-value pair */
            key = ptr_new_key(token, token_len, esc, doc);
            if (unlikely(!key)) return_err_alloc(false);
            if (ctx) ctx->pre = ctn_len ? (yyjson_mut_val *)ctn->uni.ptr : key;
            unsafe_yyjson_mut_obj_add(ctn, key, new_val, ctn_len);
        } else {
            /* replace exist value */
            key = pre->next->next;
            if (ctx) ctx->pre = pre;
            if (ctx) ctx->old = val;
            yyjson_mut_obj_put(ctn, key, new_val);
        }
    } else {
        /* array */
        if (ctx && (val || idx_is_last)) ctx->ctn = ctn;
        if (insert_new) {
            /* append new value */
            if (val) {
                pre->next = new_val;
                new_val->next = val;
                if (ctx) ctx->pre = pre;
                unsafe_yyjson_set_len(ctn, ctn_len + 1);
            } else if (idx_is_last) {
                if (ctx) ctx->pre = ctn_len ?
                    (yyjson_mut_val *)ctn->uni.ptr : new_val;
                yyjson_mut_arr_append(ctn, new_val);
            } else {
                return_err_resolve(false, token - hdr);
            }
        } else {
            /* replace exist value */
            if (!val) return_err_resolve(false, token - hdr);
            if (ctn_len > 1) {
                new_val->next = val->next;
                pre->next = new_val;
                if (ctn->uni.ptr == val) ctn->uni.ptr = new_val;
            } else {
                new_val->next = new_val;
                ctn->uni.ptr = new_val;
                pre = new_val;
            }
            if (ctx) ctx->pre = pre;
            if (ctx) ctx->old = val;
        }
    }

    /* all operations are completed, attach the new components to the target */
    if (unlikely(sep_ctn)) {
        if (sep_key) yyjson_mut_obj_add(sep_ctn, sep_key, sep_val);
        else yyjson_mut_arr_append(sep_ctn, sep_val);
    }
    return true;
}